

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  pointer pOVar2;
  pointer pAVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong *puVar14;
  long lVar15;
  ulong uVar16;
  pointer pAVar17;
  const_iterator __begin3;
  pointer pOVar18;
  long lVar19;
  undefined4 uVar20;
  undefined4 uVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  BasicResult<Catch::clara::detail::ParseState> result;
  ParserInfo parseInfos [512];
  undefined1 local_2168 [64];
  char *local_2128;
  size_type local_2120;
  char local_2118;
  undefined7 uStack_2117;
  undefined8 uStack_2110;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *local_2108;
  string *local_2100;
  undefined1 local_20f8 [16];
  undefined1 local_20e8 [32];
  undefined1 local_20c8 [16];
  undefined1 auStack_20b8 [24];
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_20a0;
  undefined1 *local_2088 [2];
  undefined1 local_2078 [16];
  ParserResult local_2068;
  ulong local_2038 [1025];
  undefined1 auVar21 [16];
  
  pOVar18 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar17 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar14 = local_2038;
  lVar19 = 0;
  local_2100 = exeName;
  memset(puVar14,0,0x2000);
  lVar12 = (long)pOVar2 - (long)pOVar18;
  if (lVar12 != 0) {
    lVar19 = 0;
    do {
      lVar19 = lVar19 + 1;
      *puVar14 = (ulong)pOVar18;
      pOVar18 = pOVar18 + 1;
      puVar14 = puVar14 + 2;
    } while (pOVar18 != pOVar2);
  }
  lVar15 = (long)pAVar3 - (long)pAVar17;
  if (lVar15 != 0) {
    uVar13 = lVar15 - 0x60;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar13;
    uVar20 = SUB164(auVar26 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar23 = (undefined4)(uVar13 / 0x180000000);
    auVar21._0_8_ = CONCAT44(uVar23,uVar20);
    auVar21._8_4_ = uVar20;
    auVar21._12_4_ = uVar23;
    auVar22._0_8_ = auVar21._0_8_ >> 6;
    auVar22._8_8_ = auVar21._8_8_ >> 6;
    puVar14 = local_2038 + lVar19 * 2 + 2;
    uVar16 = 0;
    auVar22 = auVar22 ^ _DAT_0019b0c0;
    do {
      auVar24._8_4_ = (int)pAVar17;
      auVar24._0_8_ = pAVar17;
      auVar24._12_4_ = (int)((ulong)pAVar17 >> 0x20);
      auVar25._8_4_ = (int)uVar16;
      auVar25._0_8_ = uVar16;
      auVar25._12_4_ = (int)(uVar16 >> 0x20);
      auVar26 = (auVar25 | _DAT_0019b0b0) ^ _DAT_0019b0c0;
      if ((bool)(~(auVar26._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar26._0_4_ ||
                  auVar22._4_4_ < auVar26._4_4_) & 1)) {
        puVar14[-2] = (ulong)pAVar17;
      }
      if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
          auVar26._12_4_ <= auVar22._12_4_) {
        *puVar14 = auVar24._8_8_ + 0x60;
      }
      uVar16 = uVar16 + 2;
      pAVar17 = pAVar17 + 2;
      puVar14 = puVar14 + 4;
    } while ((uVar13 / 0x60 + 2 & 0xfffffffffffffffe) != uVar16);
  }
  ExeName::set(&local_2068,&this->m_exeName,local_2100);
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c0898;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2068.m_errorMessage._M_dataplus._M_p != &local_2068.m_errorMessage.field_2) {
    operator_delete(local_2068.m_errorMessage._M_dataplus._M_p);
  }
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001c08f0;
  this_00 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
            (auStack_20b8 + 8);
  local_20c8._0_4_ = 1;
  local_20c8._8_8_ = (tokens->it)._M_current;
  auStack_20b8._0_8_ = (tokens->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (this_00,&tokens->m_tokenBuffer);
  local_2168._8_4_ = Ok;
  local_2168._0_8_ = &PTR__ResultValueBase_001c0790;
  local_2168._16_4_ = local_20c8._0_4_;
  local_2168._24_8_ = local_20c8._8_8_;
  local_2168._32_8_ = auStack_20b8._0_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2168 + 0x28),this_00);
  lVar12 = (lVar15 >> 5) * -0x5555555555555555 + (lVar12 >> 3) * -0x1111111111111111;
  local_2168._0_8_ = &PTR__BasicResult_001c0738;
  local_2128 = &local_2118;
  local_2120 = 0;
  local_2118 = '\0';
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (this_00);
  paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
  local_20e8._24_8_ =
       (long)&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
              field_0 + 8;
  local_2108 = &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer;
  do {
    (**(_func_int **)(local_2168._0_8_ + 0x10))
              ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2168);
    local_20c8._0_8_ = local_2168._24_8_;
    local_20c8._8_8_ = local_2168._32_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2168 + 0x28));
    uVar10 = auStack_20b8._8_8_;
    uVar9 = auStack_20b8._0_8_;
    uVar8 = local_20c8._8_8_;
    uVar7 = local_20c8._0_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8);
    if ((uVar9 == uVar10) && (uVar7 == uVar8)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_001c0710;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2168._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001c0790;
      if (local_2168._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = local_2168._16_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2168._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2168._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(local_2108,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2168 + 0x28));
      }
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c0738;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_2128 == &local_2118) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_2117,local_2118);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2110;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2128;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_2117,local_2118);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2120;
      local_2120 = 0;
      local_2118 = '\0';
      local_2128 = &local_2118;
      break;
    }
    if (lVar12 == 0) {
      iVar11 = 8;
      bVar6 = false;
    }
    else {
      bVar6 = false;
      puVar14 = local_2038 + 1;
      lVar19 = lVar12;
      do {
        plVar4 = (long *)puVar14[-1];
        lVar15 = (**(code **)(*plVar4 + 0x20))(plVar4);
        if ((lVar15 == 0) ||
           (uVar13 = *puVar14, uVar16 = (**(code **)(*plVar4 + 0x20))(plVar4), uVar13 < uVar16)) {
          (**(_func_int **)(local_2168._0_8_ + 0x10))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2168);
          local_20f8._0_8_ = local_2168._24_8_;
          local_20f8._8_8_ = local_2168._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)local_20e8,
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2168 + 0x28));
          (**(code **)(*plVar4 + 0x18))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8,plVar4,
                     local_2100,local_20f8);
          ResultValueBase<Catch::clara::detail::ParseState>::operator=
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2168,
                     (ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8);
          ::std::__cxx11::string::operator=((string *)&local_2128,(string *)local_2088);
          local_20c8._0_8_ = &PTR__BasicResult_001c0738;
          if (local_2088[0] != local_2078) {
            operator_delete(local_2088[0]);
          }
          local_20c8._0_8_ = &PTR__ResultValueBase_001c0790;
          if (local_20c8._8_4_ == Ok) {
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(&local_20a0);
          }
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)local_20e8);
          if (local_2168._8_4_ == Ok) {
            (**(_func_int **)(local_2168._0_8_ + 0x10))
                      ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2168);
            if (local_2168._16_4_ == NoMatch) goto LAB_0017da08;
            *puVar14 = *puVar14 + 1;
            iVar11 = 8;
            bVar6 = true;
          }
          else {
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase.m_type = local_2168._8_4_;
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c0738;
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
            if (local_2128 == &local_2118) {
              paVar1->_M_allocated_capacity = CONCAT71(uStack_2117,local_2118);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
                   uStack_2110;
            }
            else {
              (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2128;
              (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
                   CONCAT71(uStack_2117,local_2118);
            }
            (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2120;
            local_2120 = 0;
            local_2118 = '\0';
            iVar11 = 1;
            local_2128 = &local_2118;
          }
          bVar5 = false;
        }
        else {
LAB_0017da08:
          iVar11 = 0;
          bVar5 = true;
        }
        if (!bVar5) goto LAB_0017da6c;
        puVar14 = puVar14 + 2;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
      iVar11 = 8;
    }
LAB_0017da6c:
    if (iVar11 == 8) {
      (**(_func_int **)(local_2168._0_8_ + 0x10))
                ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2168);
      if (local_2168._16_4_ == ShortCircuitAll) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_001c0710;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase.m_type = local_2168._8_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001c0790;
        if (local_2168._8_4_ == Ok) {
          (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
          m_value.m_type = ShortCircuitAll;
          *(undefined8 *)local_20e8._24_8_ = local_2168._24_8_;
          ((Iterator *)(local_20e8._24_8_ + 8))->_M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2168._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector(local_2108,
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2168 + 0x28));
        }
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c0738;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if (local_2128 == &local_2118) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_2117,local_2118);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2110
          ;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2128;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
               CONCAT71(uStack_2117,local_2118);
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2120;
        local_2120 = 0;
        local_2118 = '\0';
        local_2128 = &local_2118;
      }
      else {
        iVar11 = 0;
        if (bVar6) goto LAB_0017dbe1;
        (**(_func_int **)(local_2168._0_8_ + 0x10))
                  ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2168);
        local_20c8._0_8_ = local_2168._24_8_;
        local_20c8._8_8_ = local_2168._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2168 + 0x28));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_20f8,"Unrecognised token: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (auStack_20b8._0_8_ + 8));
        BasicResult<Catch::clara::detail::ParseState>::BasicResult
                  (__return_storage_ptr__,RuntimeError,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20f8);
        if ((pointer)local_20f8._0_8_ != (pointer)local_20e8) {
          operator_delete((void *)local_20f8._0_8_);
        }
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *
                )auStack_20b8);
      }
      iVar11 = 1;
    }
LAB_0017dbe1:
  } while (iVar11 == 0);
  local_2168._0_8_ = &PTR__BasicResult_001c0738;
  if (local_2128 != &local_2118) {
    operator_delete(local_2128);
  }
  local_2168._0_8_ = &PTR__ResultValueBase_001c0790;
  if (local_2168._8_4_ == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2168 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }